

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDisallowedCommand.cxx
# Opt level: O3

bool __thiscall
cmDisallowedCommand::InitialPass
          (cmDisallowedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  cmCommand *pcVar2;
  PolicyStatus PVar3;
  int iVar4;
  char *__s;
  PolicyID id;
  undefined1 uVar5;
  allocator<char> local_51;
  string local_50;
  
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,this->Policy,false);
  if (PVar3 - NEW < 3) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,this->Message,&local_51);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    uVar5 = 1;
  }
  else {
    if (PVar3 == WARN) {
      pcVar1 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_50,(cmPolicies *)(ulong)this->Policy,id);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar2 = this->Command;
    pcVar2->Makefile = (this->super_cmCommand).Makefile;
    iVar4 = (*pcVar2->_vptr_cmCommand[3])(pcVar2,args,status);
    uVar5 = (undefined1)iVar4;
    __s = cmCommand::GetError(this->Command);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)uVar5;
}

Assistant:

bool cmDisallowedCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& status)
{
  switch (this->Makefile->GetPolicyStatus(this->Policy)) {
    case cmPolicies::WARN:
      this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING,
                                   cmPolicies::GetPolicyWarning(this->Policy));
      break;
    case cmPolicies::OLD:
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, this->Message);
      return true;
  }

  this->Command->SetMakefile(this->GetMakefile());
  bool const ret = this->Command->InitialPass(args, status);
  this->SetError(this->Command->GetError());
  return ret;
}